

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O1

sat_solver * Sbm_AddCardinSolver(int LogN,Vec_Int_t **pvVars)

{
  uint uVar1;
  Vec_Int_t *vVars;
  int *piVar2;
  sat_solver *s;
  int iVar3;
  int K;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  uVar6 = 1 << ((byte)LogN & 0x1f);
  iVar3 = (LogN + -1) * (LogN << ((byte)LogN & 0x1f));
  iVar5 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  iVar5 = (iVar5 >> 2) * 2 + uVar6 * 3 + -2;
  vVars = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0x10 < uVar6) {
    uVar1 = uVar6;
  }
  vVars->nSize = 0;
  vVars->nCap = uVar1;
  piVar2 = (int *)malloc((long)(int)uVar1 << 2);
  vVars->pArray = piVar2;
  vVars->nSize = uVar6;
  if (LogN != 0x1f) {
    uVar4 = 0;
    do {
      piVar2[uVar4] = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,iVar5);
  iVar3 = Sbm_AddCardinConstrPairWise(s,vVars,K);
  if (iVar3 == iVar5) {
    *pvVars = vVars;
    return s;
  }
  __assert_fail("nVarsReal == nVarsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatMap.c"
                ,0x160,"sat_solver *Sbm_AddCardinSolver(int, Vec_Int_t **)");
}

Assistant:

sat_solver * Sbm_AddCardinSolver( int LogN, Vec_Int_t ** pvVars )
{
    int nVars = 1 << LogN;
    int nVarsAlloc = nVars + 2 * (nVars * LogN * (LogN-1) / 4 + nVars - 1), nVarsReal;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVarsAlloc );
    nVarsReal = Sbm_AddCardinConstrPairWise( pSat, vVars, 2 );
    assert( nVarsReal == nVarsAlloc );
    *pvVars = vVars;
    return pSat;
}